

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::disconnect
          (RpcConnectionState *this,Exception *exception)

{
  ArrayDisposer **__return_storage_ptr__;
  Impl *impl;
  SourceLocation location;
  Promise<void> connection;
  bool bVar1;
  int line;
  char *file;
  void **ppvVar2;
  Connected *pCVar3;
  Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> *other;
  Own<kj::Canceler,_std::nullptr_t> *other_00;
  NullableValue<kj::Exception> *other_01;
  Exception *pEVar4;
  Connection *pCVar5;
  Canceler *this_00;
  Promise<void> *pPVar6;
  anon_class_16_2_189108fc *func;
  anon_class_24_3_4d11cdf1 *func_00;
  StringPtr SVar7;
  ArrayPtr<void_*const> AVar8;
  Promise<void> local_b00 [2];
  SourceLocation local_af0;
  undefined1 local_ad8 [416];
  undefined1 local_938 [16];
  Promise<void> local_928;
  Promise<void> shutdownPromise;
  Connection *dyingConnectionRef;
  undefined8 local_910;
  undefined8 local_908;
  Maybe<kj::Exception> local_900;
  undefined1 local_761;
  undefined8 uStack_760;
  bool _kj_shouldLog;
  Exception *newException;
  undefined8 local_750;
  Maybe<kj::Exception> local_748;
  undefined1 local_5b0 [8];
  NullableValue<kj::Exception> _newException549;
  undefined1 local_288 [8];
  Own<kj::Canceler,_std::nullptr_t> canceler;
  Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> dyingConnection;
  Impl *rpcSystem;
  void *addr;
  void **__end2;
  void **__begin2;
  size_t local_240;
  ArrayPtr<void_*const> *local_238;
  ArrayPtr<void_*const> *__range2;
  size_t local_228;
  String local_220;
  ArrayPtr<const_char> local_208;
  ArrayPtr<const_char> local_1f8;
  String local_1e8;
  undefined1 local_1d0 [8];
  Exception networkException;
  Type local_30;
  undefined1 local_28 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:462:5)>
  _kjDefer462;
  Exception *exception_local;
  RpcConnectionState *this_local;
  
  local_30.this = this;
  _kjDefer462.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:462:5)>_2
        )exception;
  kj::defer<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda()_1_>
            ((kj *)local_28,&local_30);
  bVar1 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
          is<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&this->connection);
  if (bVar1) {
    file = kj::Exception::getFile((Exception *)_kjDefer462.maybeFunc.ptr.field_1);
    line = kj::Exception::getLine((Exception *)_kjDefer462.maybeFunc.ptr.field_1);
    local_1f8 = (ArrayPtr<const_char>)
                kj::Exception::getDescription((Exception *)_kjDefer462.maybeFunc.ptr.field_1);
    SVar7.content.ptr = (char *)local_1f8.size_;
    SVar7.content.size_ = (size_t)local_1f8.ptr;
    kj::heapString(&local_1e8,(kj *)local_1f8.ptr,SVar7);
    kj::Exception::Exception((Exception *)local_1d0,DISCONNECTED,file,line,&local_1e8);
    kj::String::~String(&local_1e8);
    local_208 = (ArrayPtr<const_char>)
                kj::Exception::getRemoteTrace((Exception *)_kjDefer462.maybeFunc.ptr.field_1);
    bVar1 = kj::StringPtr::operator==((StringPtr *)&local_208,(void *)0x0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      SVar7 = kj::Exception::getRemoteTrace((Exception *)_kjDefer462.maybeFunc.ptr.field_1);
      local_228 = SVar7.content.size_;
      __range2 = (ArrayPtr<void_*const> *)SVar7.content.ptr;
      kj::str<kj::StringPtr>(&local_220,(StringPtr *)&__range2);
      kj::Exception::setRemoteTrace((Exception *)local_1d0,&local_220);
      kj::String::~String(&local_220);
    }
    AVar8 = kj::Exception::getStackTrace((Exception *)_kjDefer462.maybeFunc.ptr.field_1);
    local_240 = AVar8.size_;
    __begin2 = AVar8.ptr;
    local_238 = (ArrayPtr<void_*const> *)&__begin2;
    __end2 = kj::ArrayPtr<void_*const>::begin(local_238);
    ppvVar2 = kj::ArrayPtr<void_*const>::end(local_238);
    for (; __end2 != ppvVar2; __end2 = __end2 + 1) {
      kj::Exception::addTrace((Exception *)local_1d0,*__end2);
    }
    kj::Exception::addTraceHere((Exception *)local_1d0);
    pCVar3 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
             get<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&this->connection);
    impl = pCVar3->rpcSystem;
    pCVar3 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
             get<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&this->connection);
    other = kj::mv<kj::Own<capnp::_::VatNetworkBase::Connection,decltype(nullptr)>>
                      (&pCVar3->connection);
    kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::Own
              ((Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> *)&canceler.ptr,other);
    pCVar3 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
             get<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&this->connection);
    other_00 = kj::mv<kj::Own<kj::Canceler,decltype(nullptr)>>(&pCVar3->canceler);
    kj::Own<kj::Canceler,_std::nullptr_t>::Own
              ((Own<kj::Canceler,_std::nullptr_t> *)local_288,other_00);
    __return_storage_ptr__ = &_newException549.field_1.value.details.builder.disposer;
    kj::cp<kj::Exception>((Exception *)__return_storage_ptr__,(Exception *)local_1d0);
    kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,kj::Exception>::
    init<kj::Exception,kj::Exception>
              ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,kj::Exception> *)
               &this->connection,(Exception *)__return_storage_ptr__);
    kj::Exception::~Exception((Exception *)&_newException549.field_1.value.details.builder.disposer)
    ;
    local_750 = local_1d0;
    newException = (Exception *)this;
    kj::
    runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda()_2_>
              (&local_748,(kj *)&newException,func);
    other_01 = kj::_::readMaybe<kj::Exception>(&local_748);
    kj::_::NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)local_5b0,other_01);
    kj::Maybe<kj::Exception>::~Maybe(&local_748);
    pEVar4 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_5b0);
    if (pEVar4 != (Exception *)0x0) {
      uStack_760 = kj::_::NullableValue<kj::Exception>::operator*
                             ((NullableValue<kj::Exception> *)local_5b0);
      local_761 = kj::_::Debug::shouldLog(ERROR);
      while ((bool)local_761 != false) {
        kj::_::Debug::log<char_const(&)[71],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x229,ERROR,
                   "\"Uncaught exception when destroying capabilities dropped by disconnect.\", newException"
                   ,(char (*) [71])
                    "Uncaught exception when destroying capabilities dropped by disconnect.",
                   (Exception *)uStack_760);
        local_761 = false;
      }
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_5b0);
    if ((this->idle & 1U) == 0) {
      dyingConnectionRef = (Connection *)&canceler.ptr;
      local_910 = _kjDefer462.maybeFunc.ptr.field_1;
      local_908 = this;
      kj::
      runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda()_3_>
                (&local_900,(kj *)&dyingConnectionRef,func_00);
      kj::Maybe<kj::Exception>::~Maybe(&local_900);
    }
    shutdownPromise.super_PromiseBase.node.ptr =
         (PromiseBase)
         kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::operator*
                   ((Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> *)&canceler.ptr);
    pCVar5 = kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::operator->
                       ((Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> *)&canceler.ptr);
    (*pCVar5->_vptr_Connection[2])(local_938);
    kj::mv<kj::Own<capnp::_::VatNetworkBase::Connection,decltype(nullptr)>>
              ((Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> *)&canceler.ptr);
    kj::Promise<void>::attach<kj::Own<capnp::_::VatNetworkBase::Connection,decltype(nullptr)>>
              ((Promise<void> *)(local_938 + 8),
               (Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> *)local_938);
    kj::addRef<capnp::_::RpcSystemBase::RpcConnectionState>((kj *)local_ad8,this);
    pEVar4 = kj::mv<kj::Exception>((Exception *)_kjDefer462.maybeFunc.ptr.field_1);
    kj::Exception::Exception((Exception *)(local_ad8 + 0x10),pEVar4);
    kj::SourceLocation::SourceLocation
              (&local_af0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,"disconnect",0x239,0x1c);
    location.function = local_af0.function;
    location.fileName = local_af0.fileName;
    location.lineNumber = local_af0.lineNumber;
    location.columnNumber = local_af0.columnNumber;
    kj::Promise<void>::
    catch_<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda(kj::Exception&&)_1_>
              (&local_928,(Type *)(local_938 + 8),location);
    disconnect(kj::Exception&&)::{lambda(kj::Exception&&)#1}::~Exception
              ((_lambda_kj__Exception____1_ *)local_ad8);
    kj::Promise<void>::~Promise((Promise<void> *)(local_938 + 8));
    kj::Promise<void>::~Promise((Promise<void> *)local_938);
    this_00 = kj::Own<kj::Canceler,_std::nullptr_t>::operator->
                        ((Own<kj::Canceler,_std::nullptr_t> *)local_288);
    kj::Canceler::cancel(this_00,(Exception *)local_1d0);
    connection = shutdownPromise;
    pPVar6 = kj::mv<kj::Promise<void>>(&local_928);
    kj::Promise<void>::Promise(local_b00,pPVar6);
    dropConnection(impl,(Connection *)connection.super_PromiseBase.node.ptr,local_b00);
    kj::Promise<void>::~Promise(local_b00);
    kj::Promise<void>::~Promise(&local_928);
    kj::Own<kj::Canceler,_std::nullptr_t>::~Own((Own<kj::Canceler,_std::nullptr_t> *)local_288);
    kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::~Own
              ((Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> *)&canceler.ptr);
    kj::Exception::~Exception((Exception *)local_1d0);
    networkException.details.builder.disposer._0_4_ = 0;
  }
  else {
    networkException.details.builder.disposer._0_4_ = 1;
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:462:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:462:5)>
               *)local_28);
  return;
}

Assistant:

void disconnect(kj::Exception&& exception) {
    // Shut down the connection with the given error.
    //
    // This will cancel `tasks`, so cannot be called from inside a task in `tasks`. Instead, use
    // `tasks.add(exception)` to schedule a shutdown, since any error thrown by a task will be
    // passed to `disconnect()` later.

    // After disconnect(), the RpcSystem could be destroyed, making `traceEncoder` a dangling
    // reference, so null it out before we return from here. We don't need it anymore once
    // disconnected anyway.
    KJ_DEFER(traceEncoder = kj::none);

    if (!connection.is<Connected>()) {
      // Already disconnected.
      return;
    }

    kj::Exception networkException(kj::Exception::Type::DISCONNECTED,
        exception.getFile(), exception.getLine(), kj::heapString(exception.getDescription()));

    // Don't throw away the stack trace.
    if (exception.getRemoteTrace() != nullptr) {
      networkException.setRemoteTrace(kj::str(exception.getRemoteTrace()));
    }
    for (void* addr: exception.getStackTrace()) {
      networkException.addTrace(addr);
    }
    // If your stack trace points here, it means that the exception became the reason that the
    // RPC connection was disconnected. The exception was then thrown by all in-flight calls and
    // all future calls on this connection.
    networkException.addTraceHere();

    // Set our connection state to Disconnected now so that no one tries to write any messages to
    // it in their destructors.
    auto& rpcSystem = connection.get<Connected>().rpcSystem;
    auto dyingConnection = kj::mv(connection.get<Connected>().connection);
    auto canceler = kj::mv(connection.get<Connected>().canceler);
    connection.init<Disconnected>(kj::cp(networkException));

    KJ_IF_SOME(newException, kj::runCatchingExceptions([&]() {
      // Carefully pull all the objects out of the tables prior to releasing them because their
      // destructors could come back and mess with the tables.
      kj::Vector<kj::Own<PipelineHook>> pipelinesToRelease;
      kj::Vector<kj::Own<ClientHook>> clientsToRelease;
      kj::Vector<decltype(Answer::task)> tasksToRelease;
      kj::Vector<kj::Promise<void>> resolveOpsToRelease;
      KJ_DEFER(tasks.clear());

      // All current questions complete with exceptions.
      questions.forEach([&](QuestionId id, Question& question) {
        KJ_IF_SOME(questionRef, question.selfRef) {
          // QuestionRef still present.
          questionRef.reject(kj::cp(networkException));

          // We need to fully disconnect each QuestionRef otherwise it holds a reference back to
          // the connection state. Meanwhile `tasks` may hold streaming calls that end up holding
          // these QuestionRefs. Technically this is a cyclic reference, but as long as the cycle
          // is broken on disconnect (which happens when the RpcSystem itself is destroyed), then
          // we're OK.
          questionRef.disconnect();
        }
      });
      // Since we've disconnected the QuestionRefs, they won't clean up the questions table for
      // us, so do that here.
      questions.release();

      answers.forEach([&](AnswerId id, Answer& answer) {
        KJ_IF_SOME(p, answer.pipeline) {
          pipelinesToRelease.add(kj::mv(p));
        }

        tasksToRelease.add(kj::mv(answer.task));

        KJ_IF_SOME(context, answer.callContext) {
          context.finish();
        }
      });

      exports.forEach([&](ExportId id, Export& exp) {
        clientsToRelease.add(kj::mv(exp.clientHook));
        KJ_IF_SOME(op, exp.resolveOp) {
          resolveOpsToRelease.add(kj::mv(op));
        }
        exp = Export();
      });

      imports.forEach([&](ImportId id, Import& import) {
        KJ_IF_SOME(f, import.promiseFulfiller) {
          f->reject(kj::cp(networkException));
        }
      });

      embargoes.forEach([&](EmbargoId id, Embargo& embargo) {
        KJ_IF_SOME(f, embargo.fulfiller) {
          f->reject(kj::cp(networkException));
        }
      });
    })) {
      // Some destructor must have thrown an exception.  There is no appropriate place to report
      // these errors.
      KJ_LOG(ERROR, "Uncaught exception when destroying capabilities dropped by disconnect.",
             newException);
    }

    // Send an abort message, but ignore failure. Don't send if idle, because we promised not to
    // send any more messages in that case... we'll just disconnect.
    if (!idle) {
      kj::runCatchingExceptions([&]() {
        auto message = dyingConnection->newOutgoingMessage(
            messageSizeHint<void>() + exceptionSizeHint(exception));
        fromException(exception, message->getBody().getAs<rpc::Message>().initAbort());
        message->send();
      });
    }

    // Indicate disconnect.
    auto& dyingConnectionRef = *dyingConnection;
    auto shutdownPromise = dyingConnection->shutdown()
        .attach(kj::mv(dyingConnection))
        .catch_([self = kj::addRef(*this), origException = kj::mv(exception)](
                  kj::Exception&& shutdownException) -> kj::Promise<void> {
          // Don't report disconnects as an error.
          if (shutdownException.getType() == kj::Exception::Type::DISCONNECTED) {
            return kj::READY_NOW;
          }
          // If the error is just what was passed in to disconnect(), don't report it back out
          // since it shouldn't be anything the caller doesn't already know about.
          if (shutdownException.getType() == origException.getType() &&
              shutdownException.getDescription() == origException.getDescription()) {
            return kj::READY_NOW;
          }
          // We are shutting down after receive error, ignore shutdown exception since underlying
          // transport is probably broken.
          if (self->receiveIncomingMessageError) {
            return kj::READY_NOW;
          }
          return kj::mv(shutdownException);
        });
    canceler->cancel(networkException);
    RpcSystemBase::dropConnection(rpcSystem, dyingConnectionRef, kj::mv(shutdownPromise));
  }